

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O0

void __thiscall CVmObjFile::read_text_mode(CVmObjFile *this,vm_val_t *retval)

{
  vmobjfile_readbuf_t *this_00;
  int iVar1;
  vm_obj_id_t obj;
  vmobjfile_ext_t *pvVar2;
  CVmObject *this_01;
  char *p;
  vm_val_t *in_RSI;
  vmobjfile_readbuf_t *in_RDI;
  size_t b;
  wchar_t nxt;
  size_t chlen;
  wchar_t ch;
  char *dst;
  CVmObjString *str;
  vm_obj_id_t strid;
  CCharmapToUni *charmap;
  vmobjfile_readbuf_t *readbuf;
  CVmDataSource *fp;
  size_t in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  wchar_t in_stack_ffffffffffffff94;
  CCharmapToUni *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  wchar_t in_stack_ffffffffffffffac;
  wchar_t *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  wchar_t in_stack_ffffffffffffffbc;
  
  get_ext((CVmObjFile *)in_RDI);
  pvVar2 = get_ext((CVmObjFile *)in_RDI);
  this_00 = pvVar2->readbuf;
  get_ext((CVmObjFile *)in_RDI);
  vm_objp(0);
  CVmObjCharSet::get_to_uni
            ((CVmObjCharSet *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  if ((this_00->rem == 0) &&
     (iVar1 = vmobjfile_readbuf_t::refill
                        (in_RDI,(CVmDataSource *)
                                CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)),
     iVar1 == 0)) {
    vm_val_t::set_nil(in_RSI);
  }
  else {
    obj = CVmObjString::create(in_stack_ffffffffffffff94,in_stack_ffffffffffffff88);
    this_01 = vm_objp(0);
    CVmObjString::cons_get_buf((CVmObjString *)this_01);
    vm_val_t::set_obj(in_RSI,obj);
    CVmStack::push(in_RSI);
    do {
      iVar1 = vmobjfile_readbuf_t::getch
                        ((vmobjfile_readbuf_t *)
                         CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                         (wchar_t *)in_stack_ffffffffffffffa0,(CVmDataSource *)in_RDI,
                         (CCharmapToUni *)
                         CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      if (iVar1 == 0) break;
      if (((in_stack_ffffffffffffffbc == L'\n') || (in_stack_ffffffffffffffbc == L'\r')) ||
         (in_stack_ffffffffffffffbc == L'\x2028')) {
        if (in_stack_ffffffffffffffbc == L'\n') {
          in_stack_ffffffffffffff94 = L'\r';
        }
        else {
          in_stack_ffffffffffffff94 = L'\0';
          if (in_stack_ffffffffffffffbc == L'\r') {
            in_stack_ffffffffffffff94 = L'\n';
          }
        }
        in_stack_ffffffffffffffac = in_stack_ffffffffffffff94;
        if (((in_stack_ffffffffffffff94 != L'\0') &&
            (iVar1 = vmobjfile_readbuf_t::peekch
                               ((vmobjfile_readbuf_t *)
                                CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                                in_stack_ffffffffffffffb0,
                                (CVmDataSource *)
                                CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffffa8),
                                in_stack_ffffffffffffffa0,(size_t *)in_RDI), iVar1 != 0)) &&
           (in_stack_ffffffffffffffbc == in_stack_ffffffffffffffac)) {
          vmobjfile_readbuf_t::commit_peek(this_00,(size_t)in_stack_ffffffffffffffa0);
        }
        in_stack_ffffffffffffffbc = L'\n';
        in_stack_ffffffffffffffb0 = (wchar_t *)0x1;
      }
      else {
        in_stack_ffffffffffffffb0 = (wchar_t *)utf8_ptr::s_wchar_size(in_stack_ffffffffffffffbc);
      }
      p = CVmObjString::cons_ensure_space
                    ((CVmObjString *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                     (char *)in_stack_ffffffffffffffb0,
                     CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                     (size_t)in_stack_ffffffffffffffa0);
      utf8_ptr::s_putch(p,in_stack_ffffffffffffffbc);
    } while (in_stack_ffffffffffffffbc != L'\n');
    CVmObjString::cons_shrink_buffer((CVmObjString *)in_stack_ffffffffffffffa0,(char *)in_RDI);
    CVmStack::discard();
  }
  return;
}

Assistant:

void CVmObjFile::read_text_mode(VMG_ vm_val_t *retval)
{
    /* get our file data source and read buffer from the extension */
    CVmDataSource *fp = get_ext()->fp;
    vmobjfile_readbuf_t *readbuf = get_ext()->readbuf;

    /* get our character mapper */
    CCharmapToUni *charmap =
        ((CVmObjCharSet *)vm_objp(vmg_ get_ext()->charset))
        ->get_to_uni(vmg0_);

    /* replenish the buffer if it's empty */
    if (readbuf->rem == 0 && !readbuf->refill(fp))
    {
        /* end of file - return nil */
        retval->set_nil();
        return;
    }

    /* 
     *   Allocate a string object for the result.  We have no idea how long
     *   the line will be, so start with an arbitrary guess; we'll adjust the
     *   buffer up or down as needed. 
     */
    vm_obj_id_t strid = CVmObjString::create(vmg_ FALSE, 128);
    CVmObjString *str = (CVmObjString *)vm_objp(vmg_ strid);
    char *dst = str->cons_get_buf();

    /* this string will be the return value */
    retval->set_obj(strid);

    /* push it for gc protection */
    G_stk->push(retval);

    /*
     *   Read a line of text from the file into our buffer.  Keep going
     *   until we read an entire line; we might have to read the line in
     *   chunks, since the line might end up being longer than our buffer.  
     */
    for (;;)
    {
        /* read the next character; if we can't, we're at EOF */
        wchar_t ch;
        size_t chlen;
        if (!readbuf->getch(ch, fp, charmap))
            break;

        /* if this is a CR, LF, or U+2028, it's the end of the line */
        if (ch == '\n' || ch == '\r' || ch == 0x2028)
        {
            /* newline - skip CR-LF and LR-CR pairs */
            wchar_t nxt = (ch == '\n' ? '\r' : ch == '\r' ? '\n' : 0);
            size_t b;
            if (nxt != 0 && readbuf->peekch(ch, fp, charmap, b) && ch == nxt)
                readbuf->commit_peek(b);

            /* whichever type of newline we read, store it as LF */
            ch = 10;
            chlen = 1;
        }
        else
        {
            /* ordinary character - figure the output character length */
            chlen = utf8_ptr::s_wchar_size(ch);
        }
        
        /* ensure we have enough space for it in our string */
        dst = str->cons_ensure_space(vmg_ dst, chlen, 128);
            
        /* add this character to the string */
        dst += utf8_ptr::s_putch(dst, ch);

        /* if we just read a newline, we're done */
        if (ch == '\n')
            break;
    }

    /* close the string */
    str->cons_shrink_buffer(vmg_ dst);

    /* 
     *   we now can discard the string we've been keeping on the stack to
     *   for garbage collection protection 
     */
    G_stk->discard();
}